

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

pool_ptr<soul::AST::ProcessorInstance> __thiscall
soul::AST::Connection::getProcessorInstance(Connection *this,Expression *e)

{
  bool bVar1;
  ConnectionEndpointRef *pCVar2;
  ProcessorInstanceRef *pPVar3;
  ArrayElementRef *pAVar4;
  DotOperator *pDVar5;
  Expression *pEVar6;
  pool_ptr<soul::AST::DotOperator> local_48;
  pool_ptr<soul::AST::DotOperator> dot;
  pool_ptr<soul::AST::ArrayElementRef> ar;
  pool_ptr<soul::AST::ConnectionEndpointRef> er;
  pool_ptr<soul::AST::ProcessorInstanceRef> local_20;
  pool_ptr<soul::AST::ProcessorInstanceRef> pr;
  Expression *e_local;
  
  pr.object = (ProcessorInstanceRef *)e;
  cast<soul::AST::ProcessorInstanceRef,soul::AST::Expression>((soul *)&local_20,e);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_20);
  if (bVar1) {
    pPVar3 = pool_ptr<soul::AST::ProcessorInstanceRef>::operator->(&local_20);
    pool_ptr<soul::AST::ProcessorInstance>::pool_ptr<soul::AST::ProcessorInstance,void>
              ((pool_ptr<soul::AST::ProcessorInstance> *)this,pPVar3->processorInstance);
  }
  pool_ptr<soul::AST::ProcessorInstanceRef>::~pool_ptr(&local_20);
  if (!bVar1) {
    cast<soul::AST::ConnectionEndpointRef,soul::AST::Expression>
              ((soul *)&ar,&(pr.object)->super_Expression);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&ar);
    if (bVar1) {
      pCVar2 = pool_ptr<soul::AST::ConnectionEndpointRef>::operator->
                         ((pool_ptr<soul::AST::ConnectionEndpointRef> *)&ar);
      bVar1 = pool_ptr<soul::AST::ProcessorInstanceRef>::operator!=
                        (&pCVar2->parentProcessorInstance,(void *)0x0);
      if (bVar1) {
        pCVar2 = pool_ptr<soul::AST::ConnectionEndpointRef>::operator->
                           ((pool_ptr<soul::AST::ConnectionEndpointRef> *)&ar);
        pPVar3 = pool_ptr<soul::AST::ProcessorInstanceRef>::operator*
                           (&pCVar2->parentProcessorInstance);
        getProcessorInstance(this,&pPVar3->super_Expression);
      }
      else {
        pool_ptr<soul::AST::ProcessorInstance>::pool_ptr
                  ((pool_ptr<soul::AST::ProcessorInstance> *)this,(void *)0x0);
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    pool_ptr<soul::AST::ConnectionEndpointRef>::~pool_ptr
              ((pool_ptr<soul::AST::ConnectionEndpointRef> *)&ar);
    if (!bVar1) {
      cast<soul::AST::ArrayElementRef,soul::AST::Expression>
                ((soul *)&dot,&(pr.object)->super_Expression);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&dot);
      if (bVar1) {
        pAVar4 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                           ((pool_ptr<soul::AST::ArrayElementRef> *)&dot);
        pEVar6 = pool_ptr<soul::AST::Expression>::operator*(&pAVar4->object);
        getProcessorInstance(this,pEVar6);
      }
      pool_ptr<soul::AST::ArrayElementRef>::~pool_ptr((pool_ptr<soul::AST::ArrayElementRef> *)&dot);
      if (!bVar1) {
        cast<soul::AST::DotOperator,soul::AST::Expression>
                  ((soul *)&local_48,&(pr.object)->super_Expression);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_48);
        if (bVar1) {
          pDVar5 = pool_ptr<soul::AST::DotOperator>::operator->(&local_48);
          pEVar6 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pDVar5->lhs);
          getProcessorInstance(this,pEVar6);
        }
        pool_ptr<soul::AST::DotOperator>::~pool_ptr(&local_48);
        if (!bVar1) {
          pool_ptr<soul::AST::ProcessorInstance>::pool_ptr
                    ((pool_ptr<soul::AST::ProcessorInstance> *)this);
        }
      }
    }
  }
  return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

static pool_ptr<ProcessorInstance> getProcessorInstance (Expression& e)
        {
            if (auto pr = cast<ProcessorInstanceRef> (e))    return pr->processorInstance;
            if (auto er = cast<ConnectionEndpointRef> (e))   return er->parentProcessorInstance != nullptr ? getProcessorInstance (*er->parentProcessorInstance) : nullptr;
            if (auto ar = cast<ArrayElementRef> (e))         return getProcessorInstance (*ar->object);
            if (auto dot = cast<DotOperator> (e))            return getProcessorInstance (dot->lhs);

            return {};
        }